

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderGrid.cpp
# Opt level: O3

void __thiscall OrderGrid::updatePatternRange(OrderGrid *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = PatternModel::patterns(this->mModel);
  if (iVar2 < this->mVisibleRows) {
    this->mPatternStart = 0;
  }
  else {
    iVar3 = PatternModel::cursorPattern(this->mModel);
    iVar1 = this->mVisibleRows;
    iVar3 = iVar3 - iVar1 / 2;
    this->mPatternStart = iVar3;
    iVar4 = iVar1 + -1 + iVar3;
    this->mPatternEnd = iVar4;
    if (iVar3 < 0) {
      iVar4 = iVar1 + -1;
      this->mPatternEnd = iVar4;
      this->mPatternStart = 0;
      iVar3 = 0;
    }
    if (iVar4 <= iVar2) {
      return;
    }
    this->mPatternStart = (iVar2 - iVar4) + iVar3;
  }
  this->mPatternEnd = iVar2;
  return;
}

Assistant:

void OrderGrid::updatePatternRange() {
    auto totalRows = mModel.patterns();
    if (mVisibleRows > totalRows) {
        // the entire order can fit in the viewport
        mPatternStart = 0;
        mPatternEnd = totalRows;
    } else {
        // draw as much as we can fit with the cursor in the center
        mPatternStart = mModel.cursorPattern() - (mVisibleRows / 2);
        mPatternEnd = mPatternStart + mVisibleRows - 1;
        if (mPatternStart < 0) {
            mPatternEnd -= mPatternStart;
            mPatternStart = 0;
        }

        if (mPatternEnd > totalRows) {
            mPatternStart -= mPatternEnd - totalRows;
            mPatternEnd = totalRows;
        }

    }
}